

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_map.h
# Opt level: O2

void __thiscall
lemon::
VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>::
erase(VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
      *this,vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
            *keys)

{
  pointer pNVar1;
  int i;
  long lVar2;
  reference rVar3;
  
  for (lVar2 = 0;
      pNVar1 = (keys->
               super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
               )._M_impl.super__Vector_impl_data._M_start,
      lVar2 < (int)((ulong)((long)(keys->
                                  super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) >> 2);
      lVar2 = lVar2 + 1) {
    rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (&this->container,(long)pNVar1[lVar2]._id);
    *rVar3._M_p = *rVar3._M_p & ~rVar3._M_mask;
  }
  return;
}

Assistant:

virtual void erase(const std::vector<Key>& keys) {
    for (int i = 0; i < int(keys.size()); ++i) {
      container[Parent::notifier()->id(keys[i])] = Value();
    }
  }